

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O3

Vec_Ptr_t * Mpm_ManFindCells(Mio_Library_t *pMio,SC_Lib *pScl,Vec_Wec_t *vNpnConfigs)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *__ptr;
  void **__s;
  Mio_Gate_t *pMVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  iVar4 = vNpnConfigs->nSize;
  lVar5 = (long)iVar4;
  __ptr = (Vec_Ptr_t *)malloc(0x10);
  iVar1 = 8;
  if (6 < iVar4 - 1U) {
    iVar1 = iVar4;
  }
  __ptr->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar1 << 3);
  }
  __ptr->pArray = __s;
  __ptr->nSize = iVar4;
  memset(__s,0,lVar5 * 8);
  if (0 < iVar4) {
    lVar6 = 1;
    lVar7 = 0;
    do {
      iVar1 = *(int *)((long)vNpnConfigs->pArray + lVar6 * 8 + -4);
      if (iVar1 != 0) {
        if (iVar1 < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = **(int **)(&vNpnConfigs->pArray->nCap + lVar6 * 2) >> 0x11;
        if (((int)uVar2 < 0) || ((pScl->vCells).nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pMVar3 = Mio_LibraryReadGateByName(pMio,*(pScl->vCells).pArray[uVar2],(char *)0x0);
        if (pMVar3 == (Mio_Gate_t *)0x0) {
          if (__s != (void **)0x0) {
            free(__s);
          }
          free(__ptr);
          return (Vec_Ptr_t *)0x0;
        }
        if (lVar5 <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[lVar7] = pMVar3;
        iVar4 = vNpnConfigs->nSize;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 2;
    } while (lVar7 < iVar4);
  }
  return __ptr;
}

Assistant:

Vec_Ptr_t * Mpm_ManFindCells( Mio_Library_t * pMio, SC_Lib * pScl, Vec_Wec_t * vNpnConfigs )
{
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vClass;
    Mio_Gate_t * pMioGate;
    SC_Cell * pCell;
    int Config, iClass;
    vNpnGatesMio = Vec_PtrStart( Vec_WecSize(vNpnConfigs) );
    Vec_WecForEachLevel( vNpnConfigs, vClass, iClass )
    {
        if ( Vec_IntSize(vClass) == 0 )
            continue;
        Config = Vec_IntEntry(vClass, 0);
        pCell = SC_LibCell( pScl, (Config >> 17) );
        pMioGate = Mio_LibraryReadGateByName( pMio, pCell->pName, NULL );
        if ( pMioGate == NULL )
        {
            Vec_PtrFree( vNpnGatesMio );
            return NULL;
        }
        assert( pMioGate != NULL );
        Vec_PtrWriteEntry( vNpnGatesMio, iClass, pMioGate );
    }
    return vNpnGatesMio;
}